

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

void __thiscall
jsoncons::jsonpath::detail::
div_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
~div_operator(div_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *this)

{
  void *in_RDI;
  
  ~div_operator((div_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *)0x5c1708);
  operator_delete(in_RDI,0x18);
  return;
}

Assistant:

std::uintmax_t operator()(string_type const& s) const noexcept
            {
                const int p = 31;
                const int m = static_cast<int>(1e9) + 9;
                std::uintmax_t hash_value = 0;
                std::uintmax_t p_pow = 1;
                for (char_type c : s) {
                    hash_value = (hash_value + (c - 'a' + 1) * p_pow) % m;
                    p_pow = (p_pow * p) % m;
                }
                return hash_value;   
            }